

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

string * __thiscall
polyscope::view::to_string_abi_cxx11_(string *__return_storage_ptr__,view *this,ProjectionMode mode)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 1) {
    pcVar2 = "Orthographic";
    paVar1 = &local_a;
  }
  else if ((int)this == 0) {
    pcVar2 = "Perspective";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(ProjectionMode mode) {
  switch (mode) {
  case ProjectionMode::Perspective:
    return "Perspective";
  case ProjectionMode::Orthographic:
    return "Orthographic";
  }
  return ""; // unreachable
}